

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BitvecSet(Bitvec *p,u32 i)

{
  anon_union_496_3_7c964c52_for_u *__src;
  u32 uVar1;
  u32 uVar2;
  uint uVar3;
  Bitvec *p_00;
  void *__dest;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  
  if (p != (Bitvec *)0x0) {
    uVar6 = i - 1;
    while( true ) {
      p_00 = p;
      if (p_00->iSize < 0xf81) {
        (p_00->u).aBitmap[uVar6 >> 3] =
             (p_00->u).aBitmap[uVar6 >> 3] | (byte)(1 << ((byte)uVar6 & 7));
        return 0;
      }
      uVar3 = p_00->iDivisor;
      if (uVar3 == 0) break;
      uVar4 = (ulong)uVar6;
      uVar6 = uVar6 % uVar3;
      p = *(Bitvec **)((long)&p_00->u + (uVar4 / uVar3) * 8);
      if (p == (Bitvec *)0x0) {
        p = sqlite3BitvecCreate(uVar3);
        *(Bitvec **)((long)&p_00->u + (uVar4 / uVar3) * 8) = p;
        if (p == (Bitvec *)0x0) {
          return 7;
        }
      }
    }
    uVar1 = uVar6 + 1;
    uVar4 = (ulong)uVar6 % 0x7c;
    __src = &p_00->u;
    uVar2 = *(u32 *)((long)&p_00->u + uVar4 * 4);
    if (uVar2 == 0) {
      uVar3 = p_00->nSet;
      if (0x7a < uVar3) {
LAB_0015c048:
        __dest = sqlite3Malloc(0x1f0);
        if (__dest != (void *)0x0) {
          memcpy(__dest,__src,0x1f0);
          memset(__src,0,0x1f0);
          p_00->iDivisor = (u32)(((ulong)p_00->iSize + 0x3d) / 0x3e);
          uVar6 = sqlite3BitvecSet(p_00,uVar1);
          for (lVar5 = 0; lVar5 != 0x7c; lVar5 = lVar5 + 1) {
            uVar1 = *(u32 *)((long)__dest + lVar5 * 4);
            if (uVar1 != 0) {
              uVar3 = sqlite3BitvecSet(p_00,uVar1);
              uVar6 = uVar6 | uVar3;
            }
          }
          sqlite3_free(__dest);
          return uVar6;
        }
        return 7;
      }
    }
    else {
      do {
        if (uVar2 == uVar1) {
          return 0;
        }
        uVar6 = (int)uVar4 + 1;
        if (0x7b < uVar6) {
          uVar6 = 0;
        }
        uVar4 = (ulong)uVar6;
        uVar2 = __src->aHash[uVar4];
      } while (uVar2 != 0);
      uVar3 = p_00->nSet;
      if (0x3d < uVar3) goto LAB_0015c048;
      uVar4 = (ulong)uVar6;
    }
    p_00->nSet = uVar3 + 1;
    *(u32 *)((long)&p_00->u + uVar4 * 4) = uVar1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecSet(Bitvec *p, u32 i){
  u32 h;
  if( p==0 ) return SQLITE_OK;
  assert( i>0 );
  assert( i<=p->iSize );
  i--;
  while((p->iSize > BITVEC_NBIT) && p->iDivisor) {
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    if( p->u.apSub[bin]==0 ){
      p->u.apSub[bin] = sqlite3BitvecCreate( p->iDivisor );
      if( p->u.apSub[bin]==0 ) return SQLITE_NOMEM_BKPT;
    }
    p = p->u.apSub[bin];
  }
  if( p->iSize<=BITVEC_NBIT ){
    p->u.aBitmap[i/BITVEC_SZELEM] |= 1 << (i&(BITVEC_SZELEM-1));
    return SQLITE_OK;
  }
  h = BITVEC_HASH(i++);
  /* if there wasn't a hash collision, and this doesn't */
  /* completely fill the hash, then just add it without */
  /* worring about sub-dividing and re-hashing. */
  if( !p->u.aHash[h] ){
    if (p->nSet<(BITVEC_NINT-1)) {
      goto bitvec_set_end;
    } else {
      goto bitvec_set_rehash;
    }
  }
  /* there was a collision, check to see if it's already */
  /* in hash, if not, try to find a spot for it */
  do {
    if( p->u.aHash[h]==i ) return SQLITE_OK;
    h++;
    if( h>=BITVEC_NINT ) h = 0;
  } while( p->u.aHash[h] );
  /* we didn't find it in the hash.  h points to the first */
  /* available free spot. check to see if this is going to */
  /* make our hash too "full".  */
bitvec_set_rehash:
  if( p->nSet>=BITVEC_MXHASH ){
    unsigned int j;
    int rc;
    u32 *aiValues = sqlite3StackAllocRaw(0, sizeof(p->u.aHash));
    if( aiValues==0 ){
      return SQLITE_NOMEM_BKPT;
    }else{
      memcpy(aiValues, p->u.aHash, sizeof(p->u.aHash));
      memset(p->u.apSub, 0, sizeof(p->u.apSub));
      p->iDivisor = (p->iSize + BITVEC_NPTR - 1)/BITVEC_NPTR;
      rc = sqlite3BitvecSet(p, i);
      for(j=0; j<BITVEC_NINT; j++){
        if( aiValues[j] ) rc |= sqlite3BitvecSet(p, aiValues[j]);
      }
      sqlite3StackFree(0, aiValues);
      return rc;
    }
  }
bitvec_set_end:
  p->nSet++;
  p->u.aHash[h] = i;
  return SQLITE_OK;
}